

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_clear(nk_buffer *b)

{
  nk_buffer *b_local;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1a40,"void nk_buffer_clear(struct nk_buffer *)");
  }
  if (b != (nk_buffer *)0x0) {
    b->allocated = 0;
    b->size = (b->memory).size;
    b->calls = 0;
    b->needed = 0;
  }
  return;
}

Assistant:

NK_API void
nk_buffer_clear(struct nk_buffer *b)
{
    NK_ASSERT(b);
    if (!b) return;
    b->allocated = 0;
    b->size = b->memory.size;
    b->calls = 0;
    b->needed = 0;
}